

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine_unix.cpp
# Opt level: O2

bool __thiscall QFSFileEngine::isRelativePath(QFSFileEngine *this)

{
  long in_FS_OFFSET;
  bool bVar1;
  QArrayDataPointer<char16_t> local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_28.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QFileSystemEntry::filePath
            ((QString *)&local_28,
             (QFileSystemEntry *)((this->super_QAbstractFileEngine).d_ptr.d + 1));
  if ((undefined1 *)local_28.size == (undefined1 *)0x0) {
    bVar1 = true;
  }
  else {
    bVar1 = *local_28.ptr != L'/';
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QFSFileEngine::isRelativePath() const
{
    Q_D(const QFSFileEngine);
    const QString fp = d->fileEntry.filePath();
    return fp.isEmpty() || fp.at(0) != u'/';
}